

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

char * checkoption(lua_State *L,char *conv,ptrdiff_t convlen,char *buff)

{
  int iVar1;
  char *extramsg;
  int local_3c;
  char *pcStack_38;
  int oplen;
  char *option;
  char *buff_local;
  ptrdiff_t convlen_local;
  char *conv_local;
  lua_State *L_local;
  
  pcStack_38 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
  local_3c = 1;
  do {
    if (*pcStack_38 == '\0' || convlen < local_3c) {
      extramsg = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",conv);
      luaL_argerror(L,1,extramsg);
      return conv;
    }
    if (*pcStack_38 == '|') {
      local_3c = local_3c + 1;
    }
    else {
      iVar1 = memcmp(conv,pcStack_38,(long)local_3c);
      if (iVar1 == 0) {
        memcpy(buff,conv,(long)local_3c);
        buff[local_3c] = '\0';
        return conv + local_3c;
      }
    }
    pcStack_38 = pcStack_38 + local_3c;
  } while( true );
}

Assistant:

static const char *checkoption (lua_State *L, const char *conv,
                                ptrdiff_t convlen, char *buff) {
  const char *option = LUA_STRFTIMEOPTIONS;
  int oplen = 1;  /* length of options being checked */
  for (; *option != '\0' && oplen <= convlen; option += oplen) {
    if (*option == '|')  /* next block? */
      oplen++;  /* will check options with next length (+1) */
    else if (memcmp(conv, option, oplen) == 0) {  /* match? */
      memcpy(buff, conv, oplen);  /* copy valid option to buffer */
      buff[oplen] = '\0';
      return conv + oplen;  /* return next item */
    }
  }
  luaL_argerror(L, 1,
    lua_pushfstring(L, "invalid conversion specifier '%%%s'", conv));
  return conv;  /* to avoid warnings */
}